

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall Lowerer::IsConstRegOpnd(Lowerer *this,RegOpnd *opnd)

{
  StackSym *this_00;
  bool bVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a;
  
  this_00 = opnd->m_sym;
  bVar1 = StackSym::IsIntConst(this_00);
  if ((!bVar1) && (bVar1 = StackSym::IsFloatConst(this_00), !bVar1)) {
    local_1a = (opnd->super_Opnd).m_valueType.field_0;
    bVar1 = ValueType::IsUndefined((ValueType *)&local_1a.field_0);
    if (bVar1) {
      return true;
    }
    bVar1 = ValueType::IsNull((ValueType *)&local_1a.field_0);
    if (bVar1) {
      return true;
    }
    if ((this_00->field_0x18 & 8) != 0) {
      bVar1 = ValueType::IsBoolean((ValueType *)&local_1a.field_0);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Lowerer::IsConstRegOpnd(IR::RegOpnd *opnd) const
{
    StackSym *sym = opnd->m_sym;

    if (sym->IsIntConst() || sym->IsFloatConst())
    {
        return false;
    }

    const auto& vt = opnd->GetValueType();
    return vt.IsUndefined() || vt.IsNull() || (sym->m_isConst && vt.IsBoolean());
}